

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void FreeDeviceTree(VGM_BASEDEV *cBaseDev,UINT8 freeBase)

{
  VGM_BASEDEV *pVVar1;
  VGM_BASEDEV *cDevOld;
  VGM_BASEDEV *cDevCur;
  UINT8 freeBase_local;
  VGM_BASEDEV *cBaseDev_local;
  
  cDevOld = cBaseDev;
  while (cDevOld != (VGM_BASEDEV *)0x0) {
    if ((cDevOld->defInf).dataPtr != (DEV_DATA *)0x0) {
      Resmpl_Deinit(&cDevOld->resmpl);
      SndEmu_Stop(&cDevOld->defInf);
    }
    SndEmu_FreeDevLinkData(&cDevOld->defInf);
    pVVar1 = cDevOld->linkDev;
    if ((cDevOld == cBaseDev) && (freeBase == '\0')) {
      cDevOld->linkDev = (VGM_BASEDEV *)0x0;
      cDevOld = pVVar1;
    }
    else {
      free(cDevOld);
      cDevOld = pVVar1;
    }
  }
  return;
}

Assistant:

void FreeDeviceTree(VGM_BASEDEV* cBaseDev, UINT8 freeBase)
{
	VGM_BASEDEV* cDevCur;
	VGM_BASEDEV* cDevOld;
	
	cDevCur = cBaseDev;
	while(cDevCur != NULL)
	{
		if (cDevCur->defInf.dataPtr != NULL)
		{
			Resmpl_Deinit(&cDevCur->resmpl);
			SndEmu_Stop(&cDevCur->defInf);
		}
		SndEmu_FreeDevLinkData(&cDevCur->defInf);
		cDevOld = cDevCur;
		cDevCur = cDevCur->linkDev;
		if (cDevOld == cBaseDev && ! freeBase)
			cDevOld->linkDev = NULL;
		else
			free(cDevOld);
	}
	
	return;
}